

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

int ON_Buffer::Compare(ON_Buffer *a,ON_Buffer *b)

{
  ulong uVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  uchar *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ON_BUFFER_SEGMENT *pOVar8;
  ON_BUFFER_SEGMENT **ppOVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong __n;
  
  if (a == b) {
    return 0;
  }
  uVar1 = a->m_buffer_size;
  if (uVar1 < b->m_buffer_size) {
    return -1;
  }
  if (b->m_buffer_size < uVar1) {
    return 1;
  }
  ppOVar9 = &a->m_first_segment;
  pOVar8 = b->m_first_segment;
  uVar12 = 0;
  uVar7 = 0;
  uVar10 = 0;
  uVar6 = 0;
LAB_0047d08f:
  pOVar2 = *ppOVar9;
  uVar11 = 0;
LAB_0047d099:
  if (pOVar8 == (ON_BUFFER_SEGMENT *)0x0 || pOVar2 == (ON_BUFFER_SEGMENT *)0x0) {
    return 0;
  }
  do {
    if (uVar1 < uVar12 || uVar1 - uVar12 == 0) {
      return 0;
    }
    if (uVar11 == 0) {
      uVar11 = pOVar2->m_segment_position1 - pOVar2->m_segment_position0;
      if (pOVar2->m_segment_position0 <= pOVar2->m_segment_position1 && uVar11 != 0) {
        uVar7 = 0;
        goto LAB_0047d0d1;
      }
LAB_0047d174:
      ppOVar9 = &pOVar2->m_next_segment;
      goto LAB_0047d08f;
    }
LAB_0047d0d1:
    if (uVar6 == 0) {
      uVar6 = pOVar8->m_segment_position1 - pOVar8->m_segment_position0;
      if (pOVar8->m_segment_position1 < pOVar8->m_segment_position0 || uVar6 == 0) break;
      uVar10 = 0;
    }
    uVar5 = uVar11 - uVar7;
    if (uVar11 < uVar7 || uVar5 == 0) goto LAB_0047d174;
    __n = uVar6 - uVar10;
    if (uVar6 < uVar10 || __n == 0) break;
    puVar3 = pOVar8->m_segment_buffer;
    if (pOVar2->m_segment_buffer == (uchar *)0x0) {
      return -(uint)(puVar3 != (uchar *)0x0);
    }
    if (puVar3 == (uchar *)0x0) {
      return 1;
    }
    if (uVar5 < __n) {
      __n = uVar5;
    }
    if (uVar1 < __n + uVar12) {
      __n = uVar1 - uVar12;
    }
    iVar4 = memcmp(pOVar2->m_segment_buffer + uVar7,puVar3 + uVar10,__n);
    if (iVar4 != 0) {
      return iVar4 >> 0x1f | 1;
    }
    uVar7 = uVar7 + __n;
    uVar10 = uVar10 + __n;
    uVar12 = uVar12 + __n;
  } while( true );
  pOVar8 = pOVar8->m_next_segment;
  uVar6 = 0;
  goto LAB_0047d099;
}

Assistant:

int ON_Buffer::Compare( const ON_Buffer& a, const ON_Buffer& b )
{
  if ( &a == &b )
    return 0;
  if ( a.m_buffer_size < b.m_buffer_size )
    return -1;
  if ( a.m_buffer_size > b.m_buffer_size )
    return 1;

  struct ON_BUFFER_SEGMENT* aseg = a.m_first_segment;
  struct ON_BUFFER_SEGMENT* bseg = b.m_first_segment;
  const ON__UINT64 buffer_size = a.m_buffer_size;
  ON__UINT64 size = 0;
  size_t aoffset = 0;
  size_t boffset = 0;
  size_t asegsize = 0;
  size_t bsegsize = 0;  
  size_t asize = 0;
  size_t bsize = 0;  
  size_t sz;
  int rc = 0;

  while ( 0 != aseg && 0 != bseg && size < buffer_size )
  {
    if ( 0 == asegsize )
    {
      if ( aseg->m_segment_position0 >= aseg->m_segment_position1 )
      {
        aseg = aseg->m_next_segment;
        continue;
      }
      asegsize = (size_t)(aseg->m_segment_position1 - aseg->m_segment_position0);
      aoffset = 0;
    }

    if ( 0 == bsegsize )
    {
      if ( bseg->m_segment_position0 >= bseg->m_segment_position1 )
      {
        bseg = bseg->m_next_segment;
        continue;
      }
      bsegsize = (size_t)(bseg->m_segment_position1 - bseg->m_segment_position0);
      boffset = 0;
    }
    
    if ( aoffset >= asegsize )
    {
      asegsize = 0;
      aseg = aseg->m_next_segment;
      continue;
    }

    if ( boffset >= bsegsize )
    {
      bsegsize = 0;
      bseg = bseg->m_next_segment;
      continue;
    }

    if ( 0 == aseg->m_segment_buffer )
    {
      return (0 == bseg->m_segment_buffer) ? 0 : -1;
    }

    if ( 0 == bseg->m_segment_buffer )
    {
      return 1;
    }

    asize = asegsize - aoffset;
    bsize = bsegsize - boffset;
    sz = (asize <= bsize) ? asize : bsize;
    if ( size + sz > buffer_size )
      sz = (size_t)(buffer_size - size);
    rc = memcmp( aseg->m_segment_buffer + aoffset, bseg->m_segment_buffer + boffset, (size_t)sz );
    if ( 0 != rc )
      return ((rc<0)?-1:1);
    aoffset += sz;
    boffset += sz;
    size += sz;
  }

  return 0;
}